

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O2

QDebug __thiscall
QtPrivate::printSequentialContainer<QList<QSslError>>
          (QtPrivate *this,QDebug debug,char *which,QList<QSslError> *c)

{
  QSslError *pQVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  QDebug *pQVar5;
  _Head_base<0UL,_QSslErrorPrivate_*,_false> *error;
  QDebug debug_00;
  QSslError *pQVar6;
  long in_FS_OFFSET;
  _Head_base<0UL,_QSslErrorPrivate_*,_false> local_60;
  Stream local_58 [8];
  _Head_base<0UL,_QSslErrorPrivate_*,_false> local_50;
  Stream local_48 [8];
  QDebugStateSaver saver;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)debug.stream);
  *(undefined1 *)(*(long *)debug.stream + 0x30) = 0;
  pQVar5 = QDebug::operator<<((QDebug *)debug.stream,which);
  QDebug::operator<<(pQVar5,'(');
  pQVar6 = (c->d).ptr;
  lVar3 = (c->d).size;
  pQVar1 = pQVar6 + lVar3;
  if (lVar3 == 0) goto LAB_0017d3ec;
  local_50._M_head_impl = *(QSslErrorPrivate **)debug.stream;
  error = &local_50;
  *(int *)&local_50._M_head_impl[2].certificate.d.d.ptr =
       *(int *)&local_50._M_head_impl[2].certificate.d.d.ptr + 1;
  debug_00.stream = local_48;
  while( true ) {
    ::operator<<(debug_00,(QSslError *)error);
    QDebug::~QDebug((QDebug *)debug_00.stream);
    QDebug::~QDebug((QDebug *)error);
    pQVar6 = pQVar6 + 1;
LAB_0017d3ec:
    if (pQVar6 == pQVar1) break;
    pQVar5 = QDebug::operator<<((QDebug *)debug.stream,", ");
    local_60._M_head_impl = (QSslErrorPrivate *)pQVar5->stream;
    error = &local_60;
    *(int *)&local_60._M_head_impl[2].certificate.d.d.ptr =
         *(int *)&local_60._M_head_impl[2].certificate.d.d.ptr + 1;
    debug_00.stream = local_58;
  }
  QDebug::operator<<((QDebug *)debug.stream,')');
  uVar4 = *(undefined8 *)debug.stream;
  *(undefined8 *)debug.stream = 0;
  *(undefined8 *)this = uVar4;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (QDebug)(Stream *)this;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}